

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Result wabt::ParseInt<unsigned_short>(char *s,char *end,unsigned_short *out,ParseIntType parse_type)

{
  char cVar1;
  Result RVar2;
  ulong local_20;
  
  cVar1 = *s;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    if (parse_type == UnsignedOnly) {
      return (Result)Error;
    }
    RVar2 = ParseUint64(s + 1,end,&local_20);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    if (cVar1 == '-') {
      if (0x8000 < local_20) {
        return (Result)Error;
      }
      local_20 = 0x10000 - local_20;
    }
    else if (0xffff < local_20) {
      return (Result)Error;
    }
  }
  else {
    RVar2 = ParseUint64(s,end,&local_20);
    if (0xffff < local_20 || RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  *out = (unsigned_short)local_20;
  return (Result)Ok;
}

Assistant:

Result ParseInt(const char* s,
                const char* end,
                U* out,
                ParseIntType parse_type) {
  typedef typename std::make_signed<U>::type S;
  uint64_t value;
  bool has_sign = false;
  if (*s == '-' || *s == '+') {
    if (parse_type == ParseIntType::UnsignedOnly) {
      return Result::Error;
    }
    if (*s == '-') {
      has_sign = true;
    }
    s++;
  }
  CHECK_RESULT(ParseUint64(s, end, &value));

  if (has_sign) {
    // abs(INTN_MIN) == INTN_MAX + 1.
    if (value > static_cast<uint64_t>(std::numeric_limits<S>::max()) + 1) {
      return Result::Error;
    }
    value = std::numeric_limits<U>::max() - value + 1;
  } else {
    if (value > static_cast<uint64_t>(std::numeric_limits<U>::max())) {
      return Result::Error;
    }
  }
  *out = static_cast<U>(value);
  return Result::Ok;
}